

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t archive_read_disk_set_metadata_filter_callback
                  (archive *_a,
                  _func_int_archive_ptr_void_ptr_archive_entry_ptr *_metadata_filter_func,
                  void *_client_data)

{
  int iVar1;
  wchar_t magic_test;
  archive_read_disk *a;
  void *_client_data_local;
  _func_int_archive_ptr_void_ptr_archive_entry_ptr *_metadata_filter_func_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic
                    (_a,0xbadb0c5,0x7fff,"archive_read_disk_set_metadata_filter_callback");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else {
    _a[1].read_data_offset = (int64_t)_metadata_filter_func;
    _a[1].read_data_output_offset = (int64_t)_client_data;
    _a_local._4_4_ = L'\0';
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_disk_set_metadata_filter_callback(struct archive *_a,
    int (*_metadata_filter_func)(struct archive *, void *,
    struct archive_entry *), void *_client_data)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC, ARCHIVE_STATE_ANY,
	    "archive_read_disk_set_metadata_filter_callback");

	a->metadata_filter_func = _metadata_filter_func;
	a->metadata_filter_data = _client_data;
	return (ARCHIVE_OK);
}